

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

bool __thiscall
lzham::vector<lzham::lzcompressor::lzpriced_decision>::try_push_back
          (vector<lzham::lzcompressor::lzpriced_decision> *this,lzpriced_decision *obj)

{
  lzpriced_decision *plVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  
  uVar5 = this->m_size;
  if (this->m_capacity <= uVar5) {
    bVar4 = increase_capacity(this,uVar5 + 1,true,true);
    if (!bVar4) {
      return false;
    }
    uVar5 = this->m_size;
  }
  plVar1 = this->m_p;
  plVar1[uVar5].m_cost = obj->m_cost;
  iVar3 = (obj->super_lzdecision).m_len;
  uVar2 = *(undefined8 *)&(obj->super_lzdecision).m_dist;
  plVar1 = plVar1 + uVar5;
  (plVar1->super_lzdecision).m_pos = (obj->super_lzdecision).m_pos;
  (plVar1->super_lzdecision).m_len = iVar3;
  *(undefined8 *)&(plVar1->super_lzdecision).m_dist = uVar2;
  this->m_size = this->m_size + 1;
  return true;
}

Assistant:

inline bool try_push_back(const T& obj)
      {
         LZHAM_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
         {
            if (!increase_capacity(m_size + 1, true, true))
            {
               LZHAM_LOG_ERROR(5007);
               return false;
            }
         }

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;

         return true;
      }